

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_dec_multi_test.c
# Opt level: O0

int multi_dec_simple(MpiDecMultiCtx *data)

{
  int iVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  RK_U32 size;
  int iVar6;
  undefined8 uVar7;
  MppBufferGroup pvVar8;
  RK_U32 err_info;
  MppBufferGroup grp;
  RK_U32 buf_size;
  RK_U32 ver_stride;
  RK_U32 hor_stride;
  RK_U32 height;
  RK_U32 width;
  MppFrame frame;
  int local_58;
  RK_S32 get_frm;
  RK_S32 times;
  RK_U32 frm_eos;
  MPP_RET ret;
  RK_U32 quiet;
  FileBufSlot *slot;
  FileReader reader;
  MppPacket packet;
  MppApi *mpi;
  MppCtx ctx;
  RK_U32 pkt_eos;
  RK_U32 pkt_done;
  MpiDecTestCmd *cmd;
  MpiDecMultiCtx *data_local;
  
  _pkt_eos = data->cmd;
  ctx._4_4_ = 0;
  ctx._0_4_ = 0;
  mpi = (MppApi *)data->ctx;
  packet = data->mpi;
  reader = data->packet;
  slot = (FileBufSlot *)_pkt_eos->reader;
  _ret = (FileBufSlot *)0x0;
  frm_eos = data->quiet;
  iVar1 = data->packet_count;
  data->packet_count = iVar1 + 1;
  cmd = (MpiDecTestCmd *)data;
  times = reader_index_read(slot,iVar1,(FileBufSlot **)&ret);
  if ((times != MPP_OK) &&
     (_mpp_log_l(2,"mpi_dec_multi_test","Assertion %s failed at %s:%d\n",0,"ret == MPP_OK",
                 "multi_dec_simple",0x5b), (_mpp_debug & 0x10000000) != 0)) {
    abort();
  }
  if ((_ret == (FileBufSlot *)0x0) &&
     (_mpp_log_l(2,"mpi_dec_multi_test","Assertion %s failed at %s:%d\n",0,"slot","multi_dec_simple"
                 ,0x5c), (_mpp_debug & 0x10000000) != 0)) {
    abort();
  }
  ctx._0_4_ = _ret->eos;
  if ((RK_U32)ctx != 0) {
    if ((*(int *)(cmd->file_input + 0x50) < 0) ||
       (*(int *)(cmd->file_input + 0x4c) < *(int *)(cmd->file_input + 0x50))) {
      if (frm_eos == 0) {
        _mpp_log_l(4,"mpi_dec_multi_test","%p loop again\n",0,mpi);
      }
      cmd->file_input[0x48] = '\0';
      cmd->file_input[0x49] = '\0';
      cmd->file_input[0x4a] = '\0';
      cmd->file_input[0x4b] = '\0';
      ctx._0_4_ = 0;
    }
    else {
      if (frm_eos == 0) {
        _mpp_log_l(4,"mpi_dec_multi_test","%p found last packet\n",0,mpi);
      }
      cmd->file_input[0x18] = '\x01';
      cmd->file_input[0x19] = '\0';
      cmd->file_input[0x1a] = '\0';
      cmd->file_input[0x1b] = '\0';
    }
  }
  mpp_packet_set_data(reader,_ret->data);
  mpp_packet_set_size(reader,_ret->size);
  mpp_packet_set_pos(reader,_ret->data);
  mpp_packet_set_length(reader,_ret->size);
  if ((RK_U32)ctx != 0) {
    mpp_packet_set_eos(reader);
  }
  do {
    get_frm = 0;
    local_58 = 5;
    if (((ctx._4_4_ == 0) && (times = (**(code **)((long)packet + 0x10))(mpi,reader), times == 0))
       && (ctx._4_4_ = 1, *(long *)(cmd->file_input + 0x58) == 0)) {
      uVar7 = mpp_time();
      *(undefined8 *)(cmd->file_input + 0x58) = uVar7;
    }
LAB_00105093:
    frame._4_4_ = 0;
    _height = (MppFrame)0x0;
    while (times = (**(code **)((long)packet + 0x18))(mpi,&height), times == -8) {
      if (local_58 < 1) {
        _mpp_log_l(2,"mpi_dec_multi_test","decode_get_frame failed too much time\n",0);
        break;
      }
      local_58 = local_58 + -1;
      usleep(2000);
    }
    if (times != 0) {
      _mpp_log_l(2,"mpi_dec_multi_test","decode_get_frame failed ret %d\n",0,times);
      goto LAB_0010544c;
    }
    if (_height == (MppFrame)0x0) goto LAB_001053ec;
    iVar1 = mpp_frame_get_info_change(_height);
    if (iVar1 == 0) {
      if (*(long *)(cmd->file_input + 0x60) == 0) {
        uVar7 = mpp_time();
        *(undefined8 *)(cmd->file_input + 0x60) = uVar7;
      }
      iVar1 = mpp_frame_get_errinfo(_height);
      iVar6 = mpp_frame_get_discard(_height);
      if ((iVar1 != 0 || iVar6 != 0) && (frm_eos == 0)) {
        uVar2 = mpp_frame_get_errinfo(_height);
        uVar3 = mpp_frame_get_discard(_height);
        _mpp_log_l(4,"mpi_dec_multi_test","decoder_get_frame get err info:%d discard:%d.\n",0,uVar2,
                   uVar3);
      }
      if (frm_eos == 0) {
        _mpp_log_l(4,"mpi_dec_multi_test","decode_get_frame get frame %d\n",0,
                   *(undefined4 *)(cmd->file_input + 0x4c));
      }
      *(int *)(cmd->file_input + 0x4c) = *(int *)(cmd->file_input + 0x4c) + 1;
      if ((*(long *)(cmd->file_input + 0x40) != 0) && (iVar1 == 0 && iVar6 == 0)) {
        dump_mpp_frame_to_file(_height,*(FILE **)(cmd->file_input + 0x40));
      }
      fps_calc_inc(_pkt_eos->fps);
LAB_001053d0:
      get_frm = mpp_frame_get_eos(_height);
      mpp_frame_deinit(&height);
      frame._4_4_ = 1;
LAB_001053ec:
      if ((((RK_U32)ctx == 0) || (ctx._4_4_ == 0)) || (get_frm != 0)) {
        if ((((0 < *(int *)(cmd->file_input + 0x50)) &&
             (*(int *)(cmd->file_input + 0x50) <= *(int *)(cmd->file_input + 0x4c))) ||
            ((*(int *)(cmd->file_input + 0x50) == 0 && (get_frm != 0)))) || (frame._4_4_ == 0))
        goto LAB_0010544c;
      }
      else {
        usleep(1000);
      }
      goto LAB_00105093;
    }
    uVar2 = mpp_frame_get_width(_height);
    uVar3 = mpp_frame_get_height(_height);
    uVar4 = mpp_frame_get_hor_stride(_height);
    uVar5 = mpp_frame_get_ver_stride(_height);
    size = mpp_frame_get_buf_size(_height);
    if (frm_eos == 0) {
      _mpp_log_l(4,"mpi_dec_multi_test","decode_get_frame get info changed found\n",0);
    }
    if (frm_eos == 0) {
      _mpp_log_l(4,"mpi_dec_multi_test",
                 "decoder require buffer w:h [%d:%d] stride [%d:%d] buf_size %d",0,uVar2,uVar3,uVar4
                 ,uVar5,size);
    }
    pvVar8 = dec_buf_mgr_setup(*(DecBufMgr *)(cmd->file_input + 0x20),size,0x18,_pkt_eos->buf_mode);
    times = (**(code **)((long)packet + 0x70))(mpi,0x310002,pvVar8);
    if (times == 0) {
      *(MppBufferGroup *)(cmd->file_input + 0x28) = pvVar8;
      times = (**(code **)((long)packet + 0x70))(mpi,0x310003,0);
      if (times != 0) {
        _mpp_log_l(2,"mpi_dec_multi_test","info change ready failed ret %d\n",0,times);
        goto LAB_0010544c;
      }
      goto LAB_001053d0;
    }
    _mpp_log_l(2,"mpi_dec_multi_test","%p set buffer group failed ret %d\n",0,mpi,times);
LAB_0010544c:
    if (((0 < *(int *)(cmd->file_input + 0x50)) &&
        (*(int *)(cmd->file_input + 0x50) <= *(int *)(cmd->file_input + 0x4c))) ||
       ((*(int *)(cmd->file_input + 0x50) == 0 && (get_frm != 0)))) {
      cmd->file_input[0x18] = '\x01';
      cmd->file_input[0x19] = '\0';
      cmd->file_input[0x1a] = '\0';
      cmd->file_input[0x1b] = '\0';
      return times;
    }
    if (ctx._4_4_ != 0) {
      return times;
    }
    usleep(1000);
  } while( true );
}

Assistant:

static int multi_dec_simple(MpiDecMultiCtx *data)
{
    MpiDecTestCmd *cmd = data->cmd;
    RK_U32 pkt_done = 0;
    RK_U32 pkt_eos  = 0;
    MppCtx ctx  = data->ctx;
    MppApi *mpi = data->mpi;
    MppPacket packet = data->packet;
    FileReader reader = cmd->reader;
    FileBufSlot *slot = NULL;
    RK_U32 quiet = data->quiet;
    MPP_RET ret = reader_index_read(reader, data->packet_count++, &slot);

    mpp_assert(ret == MPP_OK);
    mpp_assert(slot);

    pkt_eos = slot->eos;

    if (pkt_eos) {
        if (data->frame_num < 0 || data->frame_num > data->frame_count) {
            mpp_log_q(quiet, "%p loop again\n", ctx);
            data->packet_count = 0;
            pkt_eos = 0;
        } else {
            mpp_log_q(quiet, "%p found last packet\n", ctx);
            data->loop_end = 1;
        }
    }

    mpp_packet_set_data(packet, slot->data);
    mpp_packet_set_size(packet, slot->size);
    mpp_packet_set_pos(packet, slot->data);
    mpp_packet_set_length(packet, slot->size);
    // setup eos flag
    if (pkt_eos)
        mpp_packet_set_eos(packet);

    do {
        RK_U32 frm_eos = 0;
        RK_S32 times = 5;
        // send the packet first if packet is not done
        if (!pkt_done) {
            ret = mpi->decode_put_packet(ctx, packet);
            if (MPP_OK == ret) {
                pkt_done = 1;
                if (!data->first_pkt)
                    data->first_pkt = mpp_time();
            }
        }

        // then get all available frame and release
        do {
            RK_S32 get_frm = 0;
            MppFrame frame = NULL;

        try_again:
            ret = mpi->decode_get_frame(ctx, &frame);
            if (MPP_ERR_TIMEOUT == ret) {
                if (times > 0) {
                    times--;
                    msleep(2);
                    goto try_again;
                }
                mpp_err("decode_get_frame failed too much time\n");
            }
            if (ret) {
                mpp_err("decode_get_frame failed ret %d\n", ret);
                break;
            }

            if (frame) {
                if (mpp_frame_get_info_change(frame)) {
                    RK_U32 width = mpp_frame_get_width(frame);
                    RK_U32 height = mpp_frame_get_height(frame);
                    RK_U32 hor_stride = mpp_frame_get_hor_stride(frame);
                    RK_U32 ver_stride = mpp_frame_get_ver_stride(frame);
                    RK_U32 buf_size = mpp_frame_get_buf_size(frame);
                    MppBufferGroup grp = NULL;

                    mpp_log_q(quiet, "decode_get_frame get info changed found\n");
                    mpp_log_q(quiet, "decoder require buffer w:h [%d:%d] stride [%d:%d] buf_size %d",
                              width, height, hor_stride, ver_stride, buf_size);

                    grp = dec_buf_mgr_setup(data->buf_mgr, buf_size, 24, cmd->buf_mode);
                    /* Set buffer to mpp decoder */
                    ret = mpi->control(ctx, MPP_DEC_SET_EXT_BUF_GROUP, grp);
                    if (ret) {
                        mpp_err("%p set buffer group failed ret %d\n", ctx, ret);
                        break;
                    }
                    data->frm_grp = grp;

                    /*
                     * All buffer group config done. Set info change ready to let
                     * decoder continue decoding
                     */
                    ret = mpi->control(ctx, MPP_DEC_SET_INFO_CHANGE_READY, NULL);
                    if (ret) {
                        mpp_err("info change ready failed ret %d\n", ret);
                        break;
                    }
                } else {
                    RK_U32 err_info = 0;

                    if (!data->first_frm)
                        data->first_frm = mpp_time();

                    err_info = mpp_frame_get_errinfo(frame) |
                               mpp_frame_get_discard(frame);
                    if (err_info) {
                        mpp_log_q(quiet, "decoder_get_frame get err info:%d discard:%d.\n",
                                  mpp_frame_get_errinfo(frame),
                                  mpp_frame_get_discard(frame));
                    }
                    mpp_log_q(quiet, "decode_get_frame get frame %d\n",
                              data->frame_count);

                    data->frame_count++;
                    if (data->fp_output && !err_info)
                        dump_mpp_frame_to_file(frame, data->fp_output);

                    fps_calc_inc(cmd->fps);
                }
                frm_eos = mpp_frame_get_eos(frame);
                mpp_frame_deinit(&frame);
                get_frm = 1;
            }

            // if last packet is send but last frame is not found continue
            if (pkt_eos && pkt_done && !frm_eos) {
                msleep(1);
                continue;
            }

            if ((data->frame_num > 0 && (data->frame_count >= data->frame_num)) ||
                ((data->frame_num == 0) && frm_eos))
                break;

            if (get_frm)
                continue;
            break;
        } while (1);

        if ((data->frame_num > 0 && (data->frame_count >= data->frame_num)) ||
            ((data->frame_num == 0) && frm_eos)) {
            data->loop_end = 1;
            break;
        }

        if (pkt_done)
            break;

        /*
         * why sleep here:
         * mpi->decode_put_packet will failed when packet in internal queue is
         * full,waiting the package is consumed .Usually hardware decode one
         * frame which resolution is 1080p needs 2 ms,so here we sleep 3ms
         * * is enough.
         */
        msleep(1);
    } while (1);

    return ret;
}